

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O3

void re2c::keygen<unsigned_short>
               (FILE *f,size_t count,size_t len,size_t len_match,rule_rank_t match)

{
  size_t __n;
  unsigned_short uVar1;
  uint uVar2;
  void *__ptr;
  ulong uVar3;
  
  uVar1 = Skeleton::rule2key<unsigned_short>((rule_rank_t)0x0);
  __n = count * 3;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (long)__n) {
    uVar3 = count * 6;
  }
  __ptr = operator_new__(uVar3);
  if (count != 0) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      *(short *)((long)__ptr + uVar3 * 2) = (short)len;
      *(short *)((long)__ptr + (ulong)uVar2 * 2) = (short)len_match;
      uVar3 = (ulong)(uVar2 + 2);
      *(unsigned_short *)((long)__ptr + (ulong)(uVar2 + 1) * 2) = uVar1;
      uVar2 = uVar2 + 3;
    } while (uVar3 < __n);
  }
  fwrite(__ptr,2,__n,(FILE *)f);
  operator_delete__(__ptr);
  return;
}

Assistant:

static void keygen (FILE * f, size_t count, size_t len, size_t len_match, rule_rank_t match)
{
	const key_t m = Skeleton::rule2key<key_t> (match);

	const size_t keys_size = 3 * count;
	key_t * keys = new key_t [keys_size];
	for (uint32_t i = 0; i < keys_size;)
	{
		keys[i++] = to_le<key_t>(static_cast<key_t> (len));
		keys[i++] = to_le<key_t>(static_cast<key_t> (len_match));
		keys[i++] = to_le<key_t>(m);
	}
	fwrite (keys, sizeof (key_t), keys_size, f);
	delete [] keys;
}